

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

SquareMatrix<float> __thiscall
qclab::qgates::QControlledGate2<float>::matrix(QControlledGate2<float> *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  data_type extraout_RDX;
  QControlledGate2<float> *in_RSI;
  SquareMatrix<float> SVar3;
  SquareMatrix<float> local_f0;
  SquareMatrix<float> local_e0;
  SquareMatrix<float> local_d0;
  SquareMatrix<float> local_c0;
  SquareMatrix<float> local_b0;
  SquareMatrix<float> local_a0;
  undefined4 local_8c;
  SquareMatrix<float> local_88;
  SquareMatrix<float> local_78;
  undefined1 local_68 [8];
  matrix_type CG;
  matrix_type E1;
  undefined1 local_38 [8];
  matrix_type E0;
  matrix_type I2;
  QControlledGate2<float> *this_local;
  
  dense::eye<float>((dense *)&E0.data_,2);
  dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)local_38,1.0,0.0,0.0,0.0);
  dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&CG.data_,0.0,0.0,0.0,1.0);
  iVar1 = (*(in_RSI->super_QGate2<float>).super_QObject<float>._vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))(local_68);
  if (in_RSI->controlState_ == 0) {
    iVar1 = control(in_RSI);
    iVar2 = (*(in_RSI->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      dense::kron<float>((dense *)&local_78,(SquareMatrix<float> *)local_38,
                         (SquareMatrix<float> *)local_68);
      dense::kron<float>((dense *)&local_88,(SquareMatrix<float> *)&CG.data_,
                         (SquareMatrix<float> *)&E0.data_);
      dense::operator+((dense *)this,&local_78,&local_88);
      dense::SquareMatrix<float>::~SquareMatrix(&local_88);
      dense::SquareMatrix<float>::~SquareMatrix(&local_78);
    }
    else {
      dense::kron<float>((dense *)&local_a0,(SquareMatrix<float> *)local_68,
                         (SquareMatrix<float> *)local_38);
      dense::kron<float>((dense *)&local_b0,(SquareMatrix<float> *)&E0.data_,
                         (SquareMatrix<float> *)&CG.data_);
      dense::operator+((dense *)this,&local_a0,&local_b0);
      dense::SquareMatrix<float>::~SquareMatrix(&local_b0);
      dense::SquareMatrix<float>::~SquareMatrix(&local_a0);
    }
  }
  else {
    iVar1 = control(in_RSI);
    iVar2 = (*(in_RSI->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      dense::kron<float>((dense *)&local_c0,(SquareMatrix<float> *)local_38,
                         (SquareMatrix<float> *)&E0.data_);
      dense::kron<float>((dense *)&local_d0,(SquareMatrix<float> *)&CG.data_,
                         (SquareMatrix<float> *)local_68);
      dense::operator+((dense *)this,&local_c0,&local_d0);
      dense::SquareMatrix<float>::~SquareMatrix(&local_d0);
      dense::SquareMatrix<float>::~SquareMatrix(&local_c0);
    }
    else {
      dense::kron<float>((dense *)&local_e0,(SquareMatrix<float> *)&E0.data_,
                         (SquareMatrix<float> *)local_38);
      dense::kron<float>((dense *)&local_f0,(SquareMatrix<float> *)local_68,
                         (SquareMatrix<float> *)&CG.data_);
      dense::operator+((dense *)this,&local_e0,&local_f0);
      dense::SquareMatrix<float>::~SquareMatrix(&local_f0);
      dense::SquareMatrix<float>::~SquareMatrix(&local_e0);
    }
  }
  local_8c = 1;
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_68);
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&CG.data_);
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_38);
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&E0.data_);
  SVar3.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }